

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

char __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,TextureList *list,Layer *param_2,UVChannel *uv,uint next)

{
  _List_node_base *__n;
  int iVar1;
  Logger *this_00;
  char cVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (list->super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)list) {
    cVar2 = '\0';
  }
  else {
    cVar2 = '\0';
    do {
      if ((((*(char *)((long)&p_Var3[6]._M_next + 4) == '\x01') &&
           (*(undefined1 *)((long)&p_Var3[6]._M_prev + 4) == '\x01')) &&
          (*(int *)&p_Var3[7]._M_next == 5)) &&
         ((__n = p_Var3[4]._M_prev,
          __n == (_List_node_base *)(uv->super_VMapEntry).name._M_string_length &&
          ((__n == (_List_node_base *)0x0 ||
           (iVar1 = bcmp(p_Var3[4]._M_next,(uv->super_VMapEntry).name._M_dataplus._M_p,(size_t)__n),
           iVar1 == 0)))))) {
        if (*(uint *)&p_Var3[6]._M_next == 0xffffffff || *(uint *)&p_Var3[6]._M_next == next) {
          *(uint *)&p_Var3[6]._M_next = next;
        }
        else {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"LWO: Channel mismatch, would need to duplicate surface [design bug]"
                      );
        }
        cVar2 = '\x01';
      }
      p_Var3 = (((_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
                &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)list);
  }
  return cVar2;
}

Assistant:

char LWOImporter::FindUVChannels(LWO::TextureList& list,
    LWO::Layer& /*layer*/,LWO::UVChannel& uv, unsigned int next)
{
    char ret = 0;
    for (auto &texture : list)  {

        // Ignore textures with non-UV mappings for the moment.
        if (!texture.enabled || !texture.bCanUse || texture.mapMode != LWO::Texture::UV)  {
            continue;
        }

        if (texture.mUVChannelIndex == uv.name) {
            ret = 1;

            // got it.
            if (texture.mRealUVIndex == UINT_MAX || texture.mRealUVIndex == next)
            {
                texture.mRealUVIndex = next;
            }
            else {
                // channel mismatch. need to duplicate the material.
                ASSIMP_LOG_WARN("LWO: Channel mismatch, would need to duplicate surface [design bug]");

                // TODO
            }
        }
    }
    return ret;
}